

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network.c
# Opt level: O2

void lws_get_peer_addresses
               (lws *wsi,lws_sockfd_type fd,char *name,int name_len,char *rip,int rip_len)

{
  addrinfo *paVar1;
  int iVar2;
  int *piVar3;
  char *pcVar4;
  short sVar5;
  addrinfo **__pai;
  addrinfo *local_88;
  socklen_t len;
  short local_78;
  undefined4 local_74 [3];
  sockaddr_in sin4;
  addrinfo local_58;
  
  *rip = '\0';
  *name = '\0';
  len = 0x10;
  iVar2 = getpeername(fd,(sockaddr *)&sin4,&len);
  if (iVar2 < 0) {
    piVar3 = __errno_location();
    pcVar4 = strerror(*piVar3);
    _lws_log(2,"getpeername: %s\n",pcVar4);
  }
  else {
    *rip = '\0';
    *name = '\0';
    local_58.ai_flags = 0;
    local_58.ai_family = 0;
    local_58.ai_addrlen = 0;
    local_58._20_4_ = 0;
    local_58.ai_addr = (sockaddr *)0x0;
    local_58.ai_canonname = (char *)0x0;
    local_58.ai_next = (addrinfo *)0x0;
    local_58.ai_socktype = 1;
    local_58.ai_protocol = 0;
    iVar2 = getnameinfo((sockaddr *)&sin4,0x10,name,name_len,(char *)0x0,0,0);
    if (iVar2 == 0) {
      __pai = &local_88;
      iVar2 = getaddrinfo(name,(char *)0x0,&local_58,__pai);
      if (iVar2 == 0) {
        sVar5 = 0;
        while ((sVar5 == 0 && (paVar1 = *__pai, paVar1 != (addrinfo *)0x0))) {
          if (paVar1->ai_family == 2) {
            local_74[0] = *(undefined4 *)(paVar1->ai_addr->sa_data + 2);
            sVar5 = 2;
          }
          else {
            sVar5 = 0;
          }
          __pai = &paVar1->ai_next;
        }
        local_78 = sVar5;
        freeaddrinfo(local_88);
        if (sVar5 != 0) {
          lws_plat_inet_ntop(2,local_74,rip,rip_len);
        }
      }
    }
  }
  return;
}

Assistant:

void
lws_get_peer_addresses(struct lws *wsi, lws_sockfd_type fd, char *name,
		       int name_len, char *rip, int rip_len)
{
#ifndef LWS_PLAT_OPTEE
	socklen_t len;
#ifdef LWS_WITH_IPV6
	struct sockaddr_in6 sin6;
#endif
	struct sockaddr_in sin4;
	void *p;

	rip[0] = '\0';
	name[0] = '\0';

#ifdef LWS_WITH_IPV6
	if (LWS_IPV6_ENABLED(wsi->vhost)) {
		len = sizeof(sin6);
		p = &sin6;
	} else
#endif
	{
		len = sizeof(sin4);
		p = &sin4;
	}

	if (getpeername(fd, p, &len) < 0) {
		lwsl_warn("getpeername: %s\n", strerror(LWS_ERRNO));
		goto bail;
	}

	lws_get_addresses(wsi->vhost, p, name, name_len, rip, rip_len);

bail:
#endif
	(void)wsi;
	(void)fd;
	(void)name;
	(void)name_len;
	(void)rip;
	(void)rip_len;
}